

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.h
# Opt level: O1

TerExpr * __thiscall
SQCompilation::SQParser::
newNode<SQCompilation::TerExpr,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Expr*>
          (SQParser *this,Expr *args,Expr *args_1,Expr *args_2)

{
  TerExpr *pTVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Chunk *pCVar5;
  
  pCVar5 = Arena::findChunk(this->_astArena,0x38);
  pTVar1 = (TerExpr *)pCVar5->_ptr;
  pCVar5->_ptr = (uint8_t *)(pTVar1 + 1);
  (pTVar1->super_Expr).super_Node._op = TO_TERNARY;
  (pTVar1->super_Expr).super_Node._coordinates.lineStart = -1;
  (pTVar1->super_Expr).super_Node._coordinates.columnStart = -1;
  (pTVar1->super_Expr).super_Node._coordinates.lineEnd = -1;
  (pTVar1->super_Expr).super_Node._coordinates.columnEnd = -1;
  (pTVar1->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
       (_func_int **)&PTR__ArenaObj_001a49f8;
  pTVar1->_a = args;
  pTVar1->_b = args_1;
  pTVar1->_c = args_2;
  iVar3 = (args_2->super_Node)._coordinates.lineEnd;
  iVar4 = (args_2->super_Node)._coordinates.columnEnd;
  iVar2 = (args->super_Node)._coordinates.columnStart;
  (pTVar1->super_Expr).super_Node._coordinates.lineStart = (args->super_Node)._coordinates.lineStart
  ;
  (pTVar1->super_Expr).super_Node._coordinates.columnStart = iVar2;
  (pTVar1->super_Expr).super_Node._coordinates.lineEnd = iVar3;
  (pTVar1->super_Expr).super_Node._coordinates.columnEnd = iVar4;
  return pTVar1;
}

Assistant:

N *newNode(Args... args) {
        return new (arena()) N(args...);
    }